

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

void __thiscall
JsonString_BadEscape1_Test::~JsonString_BadEscape1_Test(JsonString_BadEscape1_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonString).super_Test._vptr_Test = (_func_int **)&PTR__JsonString_001c05a8;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonString).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, BadEscape1) {
    auto p = json::make_parser (proxy_);
    p.input (R"("a\qb")").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::invalid_escape_char));
    EXPECT_EQ (p.coordinate (), (json::coord{4U, 1U}));
}